

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O2

REF_STATUS
ref_cavity_find_seg(REF_CAVITY ref_cavity,REF_INT *nodes,REF_INT *found_seg,REF_BOOL *reversed)

{
  int iVar1;
  REF_INT *pRVar2;
  ulong uVar3;
  ulong uVar4;
  REF_BOOL RVar5;
  long lVar6;
  
  *found_seg = -1;
  uVar3 = 0;
  uVar4 = (ulong)(uint)ref_cavity->maxseg;
  if (ref_cavity->maxseg < 1) {
    uVar4 = uVar3;
  }
  lVar6 = 4;
  RVar5 = 1;
  do {
    if (uVar4 == uVar3) {
      return 5;
    }
    pRVar2 = ref_cavity->s2n;
    iVar1 = *(int *)((long)pRVar2 + lVar6 + -4);
    if (iVar1 != -1) {
      if ((*nodes == iVar1) && (nodes[1] == *(int *)((long)pRVar2 + lVar6))) {
        RVar5 = 0;
LAB_001c75d6:
        *found_seg = (REF_INT)uVar3;
        *reversed = RVar5;
        return 0;
      }
      if ((nodes[1] == iVar1) && (*nodes == *(int *)((long)pRVar2 + lVar6))) goto LAB_001c75d6;
    }
    uVar3 = uVar3 + 1;
    lVar6 = lVar6 + 0xc;
  } while( true );
}

Assistant:

REF_FCN REF_STATUS ref_cavity_find_seg(REF_CAVITY ref_cavity, REF_INT *nodes,
                                       REF_INT *found_seg, REF_BOOL *reversed) {
  REF_INT seg;

  *found_seg = REF_EMPTY;

  each_ref_cavity_valid_seg(ref_cavity, seg) {
    if ((nodes[0] == ref_cavity_s2n(ref_cavity, 0, seg) &&
         nodes[1] == ref_cavity_s2n(ref_cavity, 1, seg))) {
      *found_seg = seg;
      *reversed = REF_FALSE;
      return REF_SUCCESS;
    }
    if ((nodes[1] == ref_cavity_s2n(ref_cavity, 0, seg) &&
         nodes[0] == ref_cavity_s2n(ref_cavity, 1, seg))) {
      *found_seg = seg;
      *reversed = REF_TRUE;
      return REF_SUCCESS;
    }
  }

  return REF_NOT_FOUND;
}